

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O3

wchar_t lookup_feat(char *name)

{
  int iVar1;
  long lVar2;
  feature *pfVar3;
  
  lVar2 = 0;
  pfVar3 = f_info;
  do {
    if (pfVar3->name != (char *)0x0) {
      iVar1 = strcmp(name,pfVar3->name);
      if (iVar1 == 0) goto LAB_0012c5c4;
    }
    lVar2 = lVar2 + 1;
    pfVar3 = pfVar3 + 1;
  } while (lVar2 != 0x19);
  quit_fmt("Failed to find terrain feature %s",name);
  lVar2 = 0xffffffff;
LAB_0012c5c4:
  return (wchar_t)lVar2;
}

Assistant:

int lookup_feat(const char *name)
{
	int i;

	/* Look for it */
	for (i = 0; i < FEAT_MAX; i++) {
		struct feature *feat = &f_info[i];
		if (!feat->name)
			continue;

		/* Test for equality */
		if (streq(name, feat->name))
			return i;
	}

	/* Fail horribly */
	quit_fmt("Failed to find terrain feature %s", name);
	return -1;
}